

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void ImFontAtlasBuildRenderLinesTexData(ImFontAtlas *atlas)

{
  undefined8 uVar1;
  float _z;
  bool bVar2;
  undefined8 *puVar3;
  long in_RDI;
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  float half_v;
  ImVec2 uv1;
  ImVec2 uv0;
  uint i_5;
  uint i_4;
  uint i_3;
  uint *write_ptr_1;
  uint i_2;
  uint i_1;
  uint i;
  uchar *write_ptr;
  uint pad_right;
  uint pad_left;
  uint line_width;
  uint y;
  uint n;
  ImFontAtlasCustomRect *r;
  undefined4 in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  ImFontAtlas *in_stack_ffffffffffffff60;
  ImVec4 local_88;
  float local_78;
  ImVec2 local_74;
  undefined8 local_6c;
  ImVec2 local_64;
  undefined8 local_5c;
  uint local_54;
  uint local_50;
  uint local_4c;
  long local_48;
  uint local_3c;
  uint local_38;
  uint local_34;
  long local_30;
  uint local_24;
  uint local_20;
  uint local_1c;
  uint local_18;
  uint local_14;
  ImFontAtlasCustomRect *local_10;
  long local_8;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  
  if ((*(uint *)(in_RDI + 4) & 4) == 0) {
    local_8 = in_RDI;
    local_10 = ImFontAtlas::GetCustomRectByIndex
                         (in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
    bVar2 = ImFontAtlasCustomRect::IsPacked(local_10);
    if (!bVar2) {
      __assert_fail("r->IsPacked()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_draw.cpp"
                    ,0x9d8,"void ImFontAtlasBuildRenderLinesTexData(ImFontAtlas *)");
    }
    for (local_14 = 0; local_14 < 0x40; local_14 = local_14 + 1) {
      local_18 = local_14;
      local_1c = local_14;
      local_20 = local_10->Width - local_14 >> 1;
      local_24 = (uint)local_10->Width - (local_20 + local_14);
      bVar2 = false;
      if (local_20 + local_14 + local_24 == (uint)local_10->Width) {
        bVar2 = local_14 < local_10->Height;
      }
      if (!bVar2) {
        __assert_fail("pad_left + line_width + pad_right == r->Width && y < r->Height",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_draw.cpp"
                      ,0x9e2,"void ImFontAtlasBuildRenderLinesTexData(ImFontAtlas *)");
      }
      if (*(long *)(local_8 + 0x18) == 0) {
        local_48 = *(long *)(local_8 + 0x20) +
                   (ulong)((uint)local_10->X + (local_10->Y + local_14) * *(int *)(local_8 + 0x28))
                   * 4;
        for (local_4c = 0; local_4c < local_20; local_4c = local_4c + 1) {
          *(undefined4 *)(local_48 + (ulong)local_4c * 4) = 0;
        }
        for (local_50 = 0; local_50 < local_14; local_50 = local_50 + 1) {
          *(undefined4 *)(local_48 + (ulong)local_20 * 4 + (ulong)local_50 * 4) = 0xffffffff;
        }
        for (local_54 = 0; local_54 < local_24; local_54 = local_54 + 1) {
          *(undefined4 *)
           (local_48 + (ulong)local_20 * 4 + (ulong)local_14 * 4 + (ulong)local_54 * 4) = 0;
        }
      }
      else {
        local_30 = *(long *)(local_8 + 0x18) +
                   (ulong)((uint)local_10->X + (local_10->Y + local_14) * *(int *)(local_8 + 0x28));
        for (local_34 = 0; local_34 < local_20; local_34 = local_34 + 1) {
          *(undefined1 *)(local_30 + (ulong)local_34) = 0;
        }
        for (local_38 = 0; local_38 < local_14; local_38 = local_38 + 1) {
          *(undefined1 *)(local_30 + (ulong)local_20 + (ulong)local_38) = 0xff;
        }
        for (local_3c = 0; local_3c < local_24; local_3c = local_3c + 1) {
          *(undefined1 *)(local_30 + (ulong)local_20 + (ulong)local_14 + (ulong)local_3c) = 0;
        }
      }
      ImVec2::ImVec2(&local_64,(float)((local_10->X - 1) + local_20),(float)(local_10->Y + local_14)
                    );
      auVar4._0_8_ = operator*((ImVec2 *)
                               CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                               (ImVec2 *)0x2268c7);
      auVar4._8_56_ = extraout_var;
      local_5c = vmovlpd_avx(auVar4._0_16_);
      ImVec2::ImVec2(&local_74,(float)(local_1c + 1 + local_10->X + local_20),
                     (float)(local_10->Y + 1 + local_18));
      auVar5._0_8_ = operator*((ImVec2 *)
                               CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                               (ImVec2 *)0x226933);
      auVar5._8_56_ = extraout_var_00;
      uVar1 = vmovlpd_avx(auVar5._0_16_);
      local_6c._4_4_ = (float)((ulong)uVar1 >> 0x20);
      local_78 = (local_5c._4_4_ + local_6c._4_4_) * 0.5;
      local_6c._0_4_ = (float)uVar1;
      _z = (float)local_6c;
      local_6c = uVar1;
      ImVec4::ImVec4(&local_88,(float)local_5c,local_78,_z,local_78);
      puVar3 = (undefined8 *)(local_8 + 0x70 + (ulong)local_14 * 0x10);
      *puVar3 = local_88._0_8_;
      puVar3[1] = local_88._8_8_;
    }
  }
  return;
}

Assistant:

static void ImFontAtlasBuildRenderLinesTexData(ImFontAtlas* atlas)
{
    if (atlas->Flags & ImFontAtlasFlags_NoBakedLines)
        return;

    // This generates a triangular shape in the texture, with the various line widths stacked on top of each other to allow interpolation between them
    ImFontAtlasCustomRect* r = atlas->GetCustomRectByIndex(atlas->PackIdLines);
    IM_ASSERT(r->IsPacked());
    for (unsigned int n = 0; n < IM_DRAWLIST_TEX_LINES_WIDTH_MAX + 1; n++) // +1 because of the zero-width row
    {
        // Each line consists of at least two empty pixels at the ends, with a line of solid pixels in the middle
        unsigned int y = n;
        unsigned int line_width = n;
        unsigned int pad_left = (r->Width - line_width) / 2;
        unsigned int pad_right = r->Width - (pad_left + line_width);

        // Write each slice
        IM_ASSERT(pad_left + line_width + pad_right == r->Width && y < r->Height); // Make sure we're inside the texture bounds before we start writing pixels
        if (atlas->TexPixelsAlpha8 != NULL)
        {
            unsigned char* write_ptr = &atlas->TexPixelsAlpha8[r->X + ((r->Y + y) * atlas->TexWidth)];
            for (unsigned int i = 0; i < pad_left; i++)
                *(write_ptr + i) = 0x00;
            
            for (unsigned int i = 0; i < line_width; i++)
                *(write_ptr + pad_left + i) = 0xFF;

            for (unsigned int i = 0; i < pad_right; i++)
                *(write_ptr + pad_left + line_width + i) = 0x00;
        }
        else
        {
            unsigned int* write_ptr = &atlas->TexPixelsRGBA32[r->X + ((r->Y + y) * atlas->TexWidth)];
            for (unsigned int i = 0; i < pad_left; i++)
                *(write_ptr + i) = IM_COL32_BLACK_TRANS;
            
            for (unsigned int i = 0; i < line_width; i++)
                *(write_ptr + pad_left + i) = IM_COL32_WHITE;

            for (unsigned int i = 0; i < pad_right; i++)
                *(write_ptr + pad_left + line_width + i) = IM_COL32_BLACK_TRANS;
        }

        // Calculate UVs for this line
        ImVec2 uv0 = ImVec2((float)(r->X + pad_left - 1), (float)(r->Y + y)) * atlas->TexUvScale;
        ImVec2 uv1 = ImVec2((float)(r->X + pad_left + line_width + 1), (float)(r->Y + y + 1)) * atlas->TexUvScale;
        float half_v = (uv0.y + uv1.y) * 0.5f; // Calculate a constant V in the middle of the row to avoid sampling artifacts
        atlas->TexUvLines[n] = ImVec4(uv0.x, half_v, uv1.x, half_v);
    }
}